

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

int * __thiscall
TMap<FString,_int,_THashTraits<FString>,_TValueTraits<int>_>::Insert
          (TMap<FString,_int,_THashTraits<FString>,_TValueTraits<int>_> *this,FString *key,
          int *value)

{
  Node *pNVar1;
  FString FStack_38;
  FString local_30;
  
  FString::AttachToOther(&local_30,key);
  pNVar1 = FindKey(this,&local_30);
  FString::~FString(&local_30);
  if (pNVar1 == (Node *)0x0) {
    FString::AttachToOther(&FStack_38,key);
    pNVar1 = NewKey(this,&FStack_38);
    FString::~FString(&FStack_38);
  }
  (pNVar1->Pair).Value = *value;
  return &(pNVar1->Pair).Value;
}

Assistant:

VT &Insert(const KT key, const VT &value)
	{
		Node *n = FindKey(key);
		if (n != NULL)
		{
			n->Pair.Value = value;
		}
		else
		{
			n = NewKey(key);
			::new(&n->Pair.Value) VT(value);
		}
		return n->Pair.Value;
	}